

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::DwaCompressor::compress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  char cVar1;
  CompressorScheme CVar2;
  undefined8 *puVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  size_t sVar9;
  void *pvVar10;
  int *piVar11;
  reference this_00;
  ulong uVar12;
  reference pvVar13;
  reference pvVar14;
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  *this_01;
  reference pvVar15;
  reference ppcVar16;
  BaseExc *pBVar17;
  InputExc *this_02;
  undefined4 *in_RCX;
  void *__buf;
  long in_RSI;
  long in_RDI;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  *this_03;
  undefined8 *in_R8;
  reference rVar18;
  char *dst;
  Int64 src;
  int i_2;
  uLongf dstLen;
  uLongf destLen;
  uLongf outSize;
  uLongf inSize_1;
  uint y_2;
  int scanlineSize;
  int byte;
  int x;
  char *row;
  uint y_1;
  LossyDctEncoder encoder_1;
  unsigned_short *nonlinearLut;
  ChannelData *cd_1;
  uint chan_2;
  LossyDctEncoderCsc encoder;
  uint csc;
  ChannelData *cd;
  uint chan_1;
  int y;
  uint chan;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  rowPtrs;
  vector<bool,_std::allocator<bool>_> encodedChannels;
  size_t i_1;
  char *writePtr;
  int maxY;
  int minY;
  int maxX;
  int minX;
  Int64 *acCompression;
  Int64 *totalDcUncompressedCount;
  Int64 *totalAcUncompressedCount;
  Int64 *rleRawSize;
  Int64 *rleUncompressedSize;
  Int64 *rleCompressedSize;
  Int64 *dcCompressedSize;
  Int64 *acCompressedSize;
  Int64 *unknownCompressedSize;
  Int64 *unknownUncompressedSize;
  Int64 *version;
  char *outDataPtr;
  size_t i;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  channelRules;
  unsigned_short channelRuleSize;
  size_t outBufferSize;
  int fileVersion;
  char *packedDcEnd;
  char *packedAcEnd;
  char *inDataPtr;
  undefined1 *in_stack_fffffffffffff678;
  PixelType in_stack_fffffffffffff680;
  PixelType in_stack_fffffffffffff684;
  undefined4 in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff68c;
  PixelType in_stack_fffffffffffff690;
  int in_stack_fffffffffffff694;
  PixelType in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff69c;
  PixelType in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a4;
  undefined4 in_stack_fffffffffffff6a8;
  undefined4 in_stack_fffffffffffff6ac;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffff6b0;
  float in_stack_fffffffffffff6bc;
  LossyDctEncoderCsc *in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c8;
  undefined4 in_stack_fffffffffffff6cc;
  unsigned_short *in_stack_fffffffffffff6d0;
  PixelType in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  DwaCompressor *in_stack_fffffffffffff6e0;
  PixelType in_stack_fffffffffffff6e8;
  undefined8 in_stack_fffffffffffff6f0;
  PixelType in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff6fc;
  undefined4 in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff73c;
  DwaCompressor *in_stack_fffffffffffff740;
  size_t *in_stack_fffffffffffff788;
  DwaCompressor *in_stack_fffffffffffff790;
  int local_73c;
  long local_738;
  DwaCompressor *local_730;
  long local_728;
  long local_720;
  reference local_718;
  uint local_708;
  int local_704;
  int local_700;
  int local_6fc;
  char *local_6f8;
  uint local_6ec;
  LossyDctEncoderBase *in_stack_fffffffffffff940;
  reference local_460;
  reference local_450;
  uint local_444;
  reference local_440;
  reference local_430;
  reference local_420 [12];
  DwaCompressor *in_stack_fffffffffffffca0;
  uint local_18c;
  uint local_180;
  int local_17c;
  reference local_178;
  uint local_168;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  local_160 [3];
  ulong local_118;
  long local_110;
  int local_108;
  int local_104;
  int local_100;
  undefined4 local_fc;
  ulong *local_f8;
  long *local_f0;
  long *local_e8;
  long *local_e0;
  long *local_d8;
  long *local_d0;
  long *local_c8;
  long *local_c0;
  long *local_b8;
  long *local_b0;
  long *local_a8;
  long local_a0;
  ulong local_98;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  local_80;
  ushort local_62;
  ulong local_60;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  undefined8 *local_38;
  long local_20;
  
  local_48 = 0;
  local_50 = 0;
  local_54 = 2;
  local_38 = in_R8;
  local_20 = in_RSI;
  initializeDefaultChannelRules(in_stack_fffffffffffffca0);
  local_60 = 0;
  initializeBuffers(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  local_62 = 0;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  vector((vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
          *)0x87fe39);
  if (1 < local_54) {
    relevantChannelRules
              (in_stack_fffffffffffff740,
               (vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
    iVar6 = Xdr::size<unsigned_short>();
    local_62 = (ushort)iVar6;
    for (local_98 = 0; uVar12 = local_98,
        sVar8 = std::
                vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                ::size(&local_80), uVar12 < sVar8; local_98 = local_98 + 1) {
      std::
      vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
      ::operator[](&local_80,local_98);
      sVar9 = Classifier::size((Classifier *)
                               CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
      local_62 = local_62 + (short)sVar9;
    }
  }
  local_60 = local_62 + local_60;
  if (*(ulong *)(in_RDI + 0xe0) < local_60) {
    *(ulong *)(in_RDI + 0xe0) = local_60;
    if ((*(long *)(in_RDI + 0xd8) != 0) && (*(void **)(in_RDI + 0xd8) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 0xd8));
    }
    pvVar10 = operator_new__(local_60);
    *(void **)(in_RDI + 0xd8) = pvVar10;
  }
  local_a0 = *(long *)(in_RDI + 0xd8) + (ulong)local_62 + 0x58;
  if (*(long *)(in_RDI + 0xa8) != 0) {
    local_48 = *(long *)(in_RDI + 0xa8);
  }
  if (*(long *)(in_RDI + 0xb8) != 0) {
    local_50 = *(long *)(in_RDI + 0xb8);
  }
  local_a8 = *(long **)(in_RDI + 0xd8);
  local_b0 = (long *)(*(long *)(in_RDI + 0xd8) + 8);
  local_b8 = (long *)(*(long *)(in_RDI + 0xd8) + 0x10);
  local_c0 = (long *)(*(long *)(in_RDI + 0xd8) + 0x18);
  local_c8 = (long *)(*(long *)(in_RDI + 0xd8) + 0x20);
  local_d0 = (long *)(*(long *)(in_RDI + 0xd8) + 0x28);
  local_d8 = (long *)(*(long *)(in_RDI + 0xd8) + 0x30);
  local_e0 = (long *)(*(long *)(in_RDI + 0xd8) + 0x38);
  local_e8 = (long *)(*(long *)(in_RDI + 0xd8) + 0x40);
  local_f0 = (long *)(*(long *)(in_RDI + 0xd8) + 0x48);
  local_f8 = (ulong *)(*(long *)(in_RDI + 0xd8) + 0x50);
  local_fc = *in_RCX;
  piVar11 = std::min<int>(in_RCX + 2,(int *)(in_RDI + 0x24));
  local_100 = *piVar11;
  local_104 = in_RCX[1];
  piVar11 = std::min<int>(in_RCX + 3,(int *)(in_RDI + 0x28));
  local_108 = *piVar11;
  puVar3 = *(undefined8 **)(in_RDI + 0xd8);
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[10] = 0;
  *local_a8 = (long)local_54;
  *local_f8 = (ulong)*(uint *)(in_RDI + 0x10);
  setupChannelData(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8,
                   (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),(int)in_stack_fffffffffffff6d0);
  if (1 < local_54) {
    local_110 = *(long *)(in_RDI + 0xd8) + 0x58;
    Xdr::write<Imf_2_5::CharPtrIO,char*>
              ((char **)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
               (unsigned_short)((ulong)in_stack_fffffffffffff678 >> 0x30));
    for (local_118 = 0; uVar12 = local_118,
        sVar8 = std::
                vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                ::size(&local_80), uVar12 < sVar8; local_118 = local_118 + 1) {
      this_00 = std::
                vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                ::operator[](&local_80,local_118);
      Classifier::write(this_00,(int)&local_110,__buf,sVar8);
    }
  }
  std::
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          *)(in_RDI + 0x60));
  std::allocator<bool>::allocator((allocator<bool> *)0x8802f2);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
             CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680));
  std::allocator<bool>::~allocator((allocator<bool> *)0x88031e);
  std::
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          *)(in_RDI + 0x60));
  std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>::allocator
            ((allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_> *)0x88034c);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
           CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698),
           (allocator_type *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
  std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>::~allocator
            ((allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_> *)0x880378);
  local_168 = 0;
  while( true ) {
    uVar12 = (ulong)local_168;
    sVar8 = std::
            vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0x60));
    if (sVar8 <= uVar12) break;
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                        CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    local_178 = rVar18;
    std::_Bit_reference::operator=(&local_178,false);
    local_168 = local_168 + 1;
  }
  local_40 = local_20;
  local_17c = local_104;
  while( true ) {
    if (local_108 < local_17c) break;
    local_180 = 0;
    while( true ) {
      sVar8 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                      *)(in_RDI + 0x60));
      if (sVar8 <= local_180) break;
      pvVar13 = std::
                vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              *)(in_RDI + 0x60),(ulong)local_180);
      iVar6 = Imath_2_5::modp(in_stack_fffffffffffff684,in_stack_fffffffffffff680);
      if (iVar6 == 0) {
        std::
        vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ::operator[](local_160,(ulong)local_180);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                   CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                   (value_type *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
        iVar6 = pvVar13->width;
        iVar7 = pixelTypeSize(in_stack_fffffffffffff684);
        local_40 = local_40 + iVar6 * iVar7;
      }
      local_180 = local_180 + 1;
    }
    local_17c = local_17c + 1;
  }
  local_40 = local_20;
  local_18c = 0;
  while( true ) {
    sVar8 = std::
            vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
            ::size((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                    *)(in_RDI + 0x78));
    if (sVar8 <= local_18c) break;
    this_03 = (vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
               *)(in_RDI + 0x78);
    pvVar14 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    std::
    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
    ::operator[](local_160,(long)pvVar14->idx[0]);
    pvVar14 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    std::
    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
    ::operator[](local_160,(long)pvVar14->idx[1]);
    pvVar14 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    std::
    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
    ::operator[](local_160,(long)pvVar14->idx[2]);
    this_01 = (vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               *)(in_RDI + 0x60);
    pvVar14 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    pvVar13 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)pvVar14->idx[0]);
    in_stack_fffffffffffff680 = pvVar13->width;
    pvVar14 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    std::
    vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
    ::operator[](this_01,(long)pvVar14->idx[0]);
    pvVar14 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    pvVar13 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)pvVar14->idx[0]);
    in_stack_fffffffffffff690 = pvVar13->type;
    pvVar14 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    pvVar13 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)pvVar14->idx[1]);
    in_stack_fffffffffffff698 = pvVar13->type;
    pvVar14 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_03,(ulong)local_18c);
    pvVar13 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)pvVar14->idx[2]);
    in_stack_fffffffffffff6a0 = pvVar13->type;
    in_stack_fffffffffffff678 = dwaCompressorToNonlinear;
    LossyDctEncoderCsc::LossyDctEncoderCsc
              (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b0,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
               (char *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698),
               (char *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
               in_stack_fffffffffffff6d0,in_stack_fffffffffffff6d8,(int)in_stack_fffffffffffff6e0,
               in_stack_fffffffffffff6e8,(PixelType)in_stack_fffffffffffff6f0,
               in_stack_fffffffffffff6f8);
    LossyDctEncoderBase::execute(in_stack_fffffffffffff940);
    iVar6 = LossyDctEncoderBase::numAcValuesEncoded((LossyDctEncoderBase *)(local_420 + 1));
    *local_e8 = *local_e8 + (long)iVar6;
    iVar6 = LossyDctEncoderBase::numDcValuesEncoded((LossyDctEncoderBase *)(local_420 + 1));
    *local_f0 = *local_f0 + (long)iVar6;
    iVar6 = LossyDctEncoderBase::numAcValuesEncoded((LossyDctEncoderBase *)(local_420 + 1));
    local_48 = local_48 + (long)iVar6 * 2;
    iVar6 = LossyDctEncoderBase::numDcValuesEncoded((LossyDctEncoderBase *)(local_420 + 1));
    local_50 = local_50 + (long)iVar6 * 2;
    std::
    vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
    ::operator[]((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                  *)(in_RDI + 0x78),(ulong)local_18c);
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                        CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    local_420[0] = rVar18;
    std::_Bit_reference::operator=(local_420,true);
    std::
    vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
    ::operator[]((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                  *)(in_RDI + 0x78),(ulong)local_18c);
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                        CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    local_430 = rVar18;
    std::_Bit_reference::operator=(&local_430,true);
    std::
    vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
    ::operator[]((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                  *)(in_RDI + 0x78),(ulong)local_18c);
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                        CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    local_440 = rVar18;
    std::_Bit_reference::operator=(&local_440,true);
    LossyDctEncoderCsc::~LossyDctEncoderCsc((LossyDctEncoderCsc *)0x880ab8);
    local_18c = local_18c + 1;
  }
  local_444 = 0;
  while( true ) {
    uVar12 = (ulong)local_444;
    sVar8 = std::
            vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0x60));
    iVar6 = (int)((ulong)in_stack_fffffffffffff6f0 >> 0x20);
    if (sVar8 <= uVar12) break;
    local_450 = std::
                vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              *)(in_RDI + 0x60),(ulong)local_444);
    rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                        CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    local_460 = rVar18;
    bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_460);
    if (!bVar5) {
      CVar2 = local_450->compression;
      if (CVar2 == UNKNOWN) {
        iVar6 = local_450->width;
        local_704 = pixelTypeSize(in_stack_fffffffffffff684);
        local_704 = iVar6 * local_704;
        local_708 = 0;
        while( true ) {
          uVar12 = (ulong)local_708;
          pvVar15 = std::
                    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ::operator[](local_160,(ulong)local_444);
          sVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(pvVar15);
          if (sVar8 <= uVar12) break;
          pcVar4 = local_450->planarUncBufferEnd;
          pvVar15 = std::
                    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ::operator[](local_160,(ulong)local_444);
          ppcVar16 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                               (pvVar15,(ulong)local_708);
          memcpy(pcVar4,*ppcVar16,(long)local_704);
          local_450->planarUncBufferEnd = local_450->planarUncBufferEnd + local_704;
          local_708 = local_708 + 1;
        }
        *local_b0 = (long)local_450->planarUncSize + *local_b0;
      }
      else if (CVar2 == LOSSY_DCT) {
        std::
        vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ::operator[](local_160,(ulong)local_444);
        in_stack_fffffffffffff680 = local_450->type;
        in_stack_fffffffffffff678 =
             (undefined1 *)
             CONCAT44((int)((ulong)in_stack_fffffffffffff678 >> 0x20),local_450->height);
        LossyDctEncoder::LossyDctEncoder
                  ((LossyDctEncoder *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,
                   in_stack_fffffffffffff6b0,
                   (char *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                   (char *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                   (unsigned_short *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698),
                   in_stack_fffffffffffff694,(int)in_stack_fffffffffffff6d0,
                   in_stack_fffffffffffff6d8);
        LossyDctEncoderBase::execute(in_stack_fffffffffffff940);
        iVar6 = LossyDctEncoderBase::numAcValuesEncoded
                          ((LossyDctEncoderBase *)&stack0xfffffffffffff918);
        *local_e8 = *local_e8 + (long)iVar6;
        iVar6 = LossyDctEncoderBase::numDcValuesEncoded
                          ((LossyDctEncoderBase *)&stack0xfffffffffffff918);
        *local_f0 = *local_f0 + (long)iVar6;
        iVar6 = LossyDctEncoderBase::numAcValuesEncoded
                          ((LossyDctEncoderBase *)&stack0xfffffffffffff918);
        local_48 = local_48 + (long)iVar6 * 2;
        iVar6 = LossyDctEncoderBase::numDcValuesEncoded
                          ((LossyDctEncoderBase *)&stack0xfffffffffffff918);
        local_50 = (long)iVar6 * 2 + local_50;
        LossyDctEncoder::~LossyDctEncoder((LossyDctEncoder *)0x880d8b);
      }
      else if (CVar2 == RLE) {
        local_6ec = 0;
        while( true ) {
          uVar12 = (ulong)local_6ec;
          pvVar15 = std::
                    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ::operator[](local_160,(ulong)local_444);
          sVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(pvVar15);
          if (sVar8 <= uVar12) break;
          pvVar15 = std::
                    vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ::operator[](local_160,(ulong)local_444);
          ppcVar16 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                               (pvVar15,(ulong)local_6ec);
          local_6f8 = *ppcVar16;
          for (local_6fc = 0; local_6fc < local_450->width; local_6fc = local_6fc + 1) {
            local_700 = 0;
            while( true ) {
              iVar6 = local_700;
              iVar7 = pixelTypeSize(in_stack_fffffffffffff684);
              if (iVar7 <= iVar6) break;
              cVar1 = *local_6f8;
              pcVar4 = local_450->planarUncRleEnd[local_700];
              local_450->planarUncRleEnd[local_700] = pcVar4 + 1;
              *pcVar4 = cVar1;
              local_700 = local_700 + 1;
              local_6f8 = local_6f8 + 1;
            }
          }
          iVar6 = local_450->width;
          iVar7 = pixelTypeSize(in_stack_fffffffffffff684);
          *local_e0 = (long)(iVar6 * iVar7) + *local_e0;
          local_6ec = local_6ec + 1;
        }
      }
      rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                          CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
      local_718 = rVar18;
      std::_Bit_reference::operator=(&local_718,true);
    }
    local_444 = local_444 + 1;
  }
  if (*local_b0 != 0) {
    local_720 = *local_b0;
    local_728 = compressBound(local_720);
    iVar7 = compress2(local_a0,&local_728,*(undefined8 *)(in_RDI + 0xe8),local_720,9);
    if (iVar7 != 0) {
      pBVar17 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar17,"Data compression (zlib) failed.");
      __cxa_throw(pBVar17,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    local_a0 = local_728 + local_a0;
    *local_b8 = local_728;
    in_stack_fffffffffffff6fc = 0;
  }
  iVar7 = (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20);
  if (*local_e8 != 0) {
    if (*(int *)(in_RDI + 0x10) == 0) {
      iVar6 = hufCompress((unsigned_short *)
                          CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),iVar6,
                          (char *)(ulong)in_stack_fffffffffffff6e8);
      *local_c0 = (long)iVar6;
    }
    else if (*(int *)(in_RDI + 0x10) == 1) {
      in_stack_fffffffffffff6e0 = (DwaCompressor *)compressBound(*local_e8 * 2);
      local_730 = in_stack_fffffffffffff6e0;
      iVar6 = compress2(local_a0,&local_730,*(undefined8 *)(in_RDI + 0xa8),*local_e8 * 2,9);
      if (iVar6 != 0) {
        this_02 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(this_02,"Data compression (zlib) failed.");
        __cxa_throw(this_02,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      *local_c0 = (long)local_730;
      in_stack_fffffffffffff6dc = 0;
    }
    local_a0 = *local_c0 + local_a0;
  }
  if (*local_f0 != 0) {
    iVar6 = Zip::compress((Zip *)in_stack_fffffffffffff6e0,
                          (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                          iVar7,(char *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8
                                                ));
    *local_c8 = (long)iVar6;
    local_a0 = *local_c8 + local_a0;
  }
  if (*local_e0 != 0) {
    iVar6 = rleCompress((int)*local_e0,*(char **)(in_RDI + 0xf8),*(char **)(in_RDI + 200));
    *local_d8 = (long)iVar6;
    local_738 = compressBound(*local_d8);
    iVar6 = compress2(local_a0,&local_738,*(undefined8 *)(in_RDI + 200),*local_d8,9);
    if (iVar6 != 0) {
      pBVar17 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar17,"Error compressing RLE\'d data.");
      __cxa_throw(pBVar17,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    *local_d0 = local_738;
    local_a0 = *local_d0 + local_a0;
  }
  for (local_73c = 0; local_73c < 0xb; local_73c = local_73c + 1) {
    Xdr::write<Imf_2_5::CharPtrIO,char*>
              ((char **)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
               (unsigned_long)in_stack_fffffffffffff678);
  }
  *local_38 = *(undefined8 *)(in_RDI + 0xd8);
  iVar6 = ((int)local_a0 - (int)*(undefined8 *)(in_RDI + 0xd8)) + 1;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
             *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x8815af)
  ;
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  ~vector((vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
           *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
  return iVar6;
}

Assistant:

int 
DwaCompressor::compress
    (const char             *inPtr,
     int                    inSize,
     IMATH_NAMESPACE::Box2i range,
     const char             *&outPtr)
{
    const char *inDataPtr   = inPtr;
    char       *packedAcEnd = 0;
    char       *packedDcEnd = 0; 
    int         fileVersion = 2;   // Starting with 2, we write the channel
                                   // classification rules into the file

    if (fileVersion < 2) 
        initializeLegacyChannelRules();
    else 
        initializeDefaultChannelRules();

    size_t outBufferSize = 0;
    initializeBuffers(outBufferSize);

    unsigned short          channelRuleSize = 0;
    std::vector<Classifier> channelRules;
    if (fileVersion >= 2) 
    {
        relevantChannelRules(channelRules);

        channelRuleSize = Xdr::size<unsigned short>();
        for (size_t i = 0; i < channelRules.size(); ++i) 
            channelRuleSize += channelRules[i].size();
    }

    //
    // Remember to allocate _outBuffer, if we haven't done so already.
    //

    outBufferSize += channelRuleSize;
    if (outBufferSize > _outBufferSize) 
    {
        _outBufferSize = outBufferSize;
        if (_outBuffer != 0)
            delete[] _outBuffer;       
        _outBuffer = new char[outBufferSize];
    }

    char *outDataPtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof(OPENEXR_IMF_NAMESPACE::Int64) +
                                   channelRuleSize];

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and deferencing
    // a vector will not be a good thing to do.
    //

    if (_packedAcBuffer)
        packedAcEnd = _packedAcBuffer;

    if (_packedDcBuffer)
        packedDcEnd = _packedDcBuffer;

    #define OBIDX(x) (Int64 *)&_outBuffer[x * sizeof (Int64)]

    Int64 *version                 = OBIDX (VERSION);
    Int64 *unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    Int64 *unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    Int64 *acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    Int64 *dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    Int64 *rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    Int64 *rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    Int64 *rleRawSize              = OBIDX (RLE_RAW_SIZE);

    Int64 *totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    Int64 *totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    Int64 *acCompression            = OBIDX (AC_COMPRESSION);

    int minX   = range.min.x;
    int maxX   = std::min(range.max.x, _max[0]);
    int minY   = range.min.y;
    int maxY   = std::min(range.max.y, _max[1]);

    //
    // Zero all the numbers in the chunk header
    //

    memset (_outBuffer, 0, NUM_SIZES_SINGLE * sizeof (Int64));

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;  
    *acCompression = _acCompression;

    setupChannelData (minX, minY, maxX, maxY);

    if (fileVersion >= 2) 
    {
        char *writePtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof(OPENEXR_IMF_NAMESPACE::Int64)];
        Xdr::write<CharPtrIO> (writePtr, channelRuleSize);
        
        for (size_t i = 0; i < channelRules.size(); ++i) 
            channelRules[i].write(writePtr);
    }

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //

    std::vector<bool> encodedChannels (_channelData.size());
    std::vector< std::vector<const char *> > rowPtrs (_channelData.size());

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        encodedChannels[chan] = false;

    inDataPtr =  inPtr;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        {

            ChannelData *cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp(y, cd->ySampling) != 0)
                continue;

            rowPtrs[chan].push_back(inDataPtr);
            inDataPtr += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);
        }
    }

    inDataPtr = inPtr;

    // 
    // Make a pass over all our CSC sets and try to encode them first
    // 

    for (unsigned int csc = 0; csc < _cscSets.size(); ++csc)
    {

        LossyDctEncoderCsc encoder
            (_dwaCompressionLevel / 100000.f,
             rowPtrs[_cscSets[csc].idx[0]],
             rowPtrs[_cscSets[csc].idx[1]],
             rowPtrs[_cscSets[csc].idx[2]],
             packedAcEnd,
             packedDcEnd,
             dwaCompressorToNonlinear,
             _channelData[_cscSets[csc].idx[0]].width,
             _channelData[_cscSets[csc].idx[0]].height,
             _channelData[_cscSets[csc].idx[0]].type,
             _channelData[_cscSets[csc].idx[1]].type,
             _channelData[_cscSets[csc].idx[2]].type);

        encoder.execute();

        *totalAcUncompressedCount  += encoder.numAcValuesEncoded();
        *totalDcUncompressedCount  += encoder.numDcValuesEncoded();

        packedAcEnd += encoder.numAcValuesEncoded() * sizeof(unsigned short);
        packedDcEnd += encoder.numDcValuesEncoded() * sizeof(unsigned short);

        encodedChannels[_cscSets[csc].idx[0]] = true;
        encodedChannels[_cscSets[csc].idx[1]] = true;
        encodedChannels[_cscSets[csc].idx[2]] = true;
    }

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        ChannelData *cd = &_channelData[chan];

        if (encodedChannels[chan])
            continue;

        switch (cd->compression)
        {
          case LOSSY_DCT:

            //
            // For LOSSY_DCT, treat this just like the CSC'd case,
            // but only operate on one channel
            //

            {
                const unsigned short *nonlinearLut = 0;

                if (!cd->pLinear)
                    nonlinearLut = dwaCompressorToNonlinear; 

                LossyDctEncoder encoder
                    (_dwaCompressionLevel / 100000.f,
                     rowPtrs[chan],
                     packedAcEnd,
                     packedDcEnd,
                     nonlinearLut,
                     cd->width,
                     cd->height,
                     cd->type);

                encoder.execute();

                *totalAcUncompressedCount  += encoder.numAcValuesEncoded();
                *totalDcUncompressedCount  += encoder.numDcValuesEncoded();

                packedAcEnd +=
                    encoder.numAcValuesEncoded() * sizeof (unsigned short);

                packedDcEnd +=
                    encoder.numDcValuesEncoded() * sizeof (unsigned short);
            }

            break;

          case RLE:

            //
            // For RLE, bash the bytes up so that the first bytes of each
            // pixel are contingous, as are the second bytes, and so on.
            //

            for (unsigned int y = 0; y < rowPtrs[chan].size(); ++y)
            {
                const char *row = rowPtrs[chan][y];

                for (int x = 0; x < cd->width; ++x)
                {
                    for (int byte = 0;
                         byte < OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                         ++byte)
                    {
                            
                        *cd->planarUncRleEnd[byte]++ = *row++;
                    }
                }

                *rleRawSize += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);
            }

            break;

          case UNKNOWN:
           
            //
            // Otherwise, just copy data over verbatim
            //

            {
                int scanlineSize = cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type);

                for (unsigned int y = 0; y < rowPtrs[chan].size(); ++y)
                {
                    memcpy (cd->planarUncBufferEnd,
                            rowPtrs[chan][y],
                            scanlineSize);
    
                    cd->planarUncBufferEnd += scanlineSize;
                }

                *unknownUncompressedSize += cd->planarUncSize;
            }

            break;

          default:

            assert (false);
        }

        encodedChannels[chan] = true;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        uLongf inSize  = (uLongf)(*unknownUncompressedSize);
        uLongf outSize = compressBound (inSize);

        if (Z_OK != ::compress2 ((Bytef *)outDataPtr,
                                 &outSize,
                                 (const Bytef *)_planarUncBuffer[UNKNOWN],
                                 inSize,
                                 9))
        {
            throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of 
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    { 
        switch (_acCompression)
        {
          case STATIC_HUFFMAN:

            *acCompressedSize = (int)
                hufCompress((unsigned short *)_packedAcBuffer,
                            (int)*totalAcUncompressedCount,
                            outDataPtr);                
            break;

          case DEFLATE:

            {
                uLongf destLen = compressBound (
                    (*totalAcUncompressedCount) * sizeof (unsigned short));

                if (Z_OK != ::compress2
                                ((Bytef *)outDataPtr,
                                 &destLen,
                                 (Bytef *)_packedAcBuffer, 
                                 (uLong)(*totalAcUncompressedCount
                                                * sizeof (unsigned short)),
                                 9))
                {
                    throw IEX_NAMESPACE::InputExc ("Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;        
            }

            break;

          default:
            
            assert (false);
        }

        outDataPtr += *acCompressedSize;
    }

    // 
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        *dcCompressedSize = _zip->compress
            (_packedDcBuffer,
             (int)(*totalDcUncompressedCount) * sizeof (unsigned short),
             outDataPtr);

        outDataPtr += *dcCompressedSize;
    }

    // 
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //    

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = rleCompress
            ((int)(*rleRawSize),
             _planarUncBuffer[RLE],
             (signed char *)_rleBuffer);

        uLongf dstLen = compressBound ((uLongf)*rleUncompressedSize);

        if (Z_OK != ::compress2
                        ((Bytef *)outDataPtr, 
                         &dstLen, 
                         (Bytef *)_rleBuffer, 
                         (uLong)(*rleUncompressedSize),
                         9))
        {
            throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");
        }
        
       *rleCompressedSize = dstLen;
        outDataPtr       += *rleCompressedSize;
    }

    // 
    // Flip the counters to XDR format
    //         

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        Int64  src = *(((Int64 *)_outBuffer) + i);
        char  *dst = (char *)(((Int64 *)_outBuffer) + i);

        Xdr::write<CharPtrIO> (dst, src);
    }

    //
    // We're done - compute the number of bytes we packed
    //

    outPtr = _outBuffer;

    return static_cast<int>(outDataPtr - _outBuffer + 1);
}